

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O3

path * __thiscall
mdsplit::mdsplitter::relative_path
          (path *__return_storage_ptr__,mdsplitter *this,path *path,path *base)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  path *this_00;
  undefined1 auVar5 [16];
  string ext;
  path base_dir;
  path local_c0;
  path local_98;
  long *local_70 [2];
  long local_60 [2];
  path local_50;
  
  cVar1 = std::filesystem::status(base);
  if (cVar1 == '\x02') {
    std::filesystem::__cxx11::path::path(&local_50,base);
  }
  else {
    std::filesystem::__cxx11::path::parent_path();
  }
  bVar2 = is_subdirectory(this,path,&this->output_dir_);
  iVar3 = std::filesystem::__cxx11::path::compare(path);
  if (bVar2 && iVar3 != 0) {
    std::filesystem::relative(__return_storage_ptr__,path);
    auVar5 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar5._8_8_ == -1 || auVar5._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(&local_c0);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_98,auVar5._0_8_);
      std::filesystem::__cxx11::path::path(&local_c0,&local_98._M_pathname,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_pathname._M_dataplus._M_p != &local_98._M_pathname.field_2) {
        operator_delete(local_98._M_pathname._M_dataplus._M_p,
                        local_98._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,local_c0._M_pathname._M_dataplus._M_p,
               local_c0._M_pathname._M_dataplus._M_p + local_c0._M_pathname._M_string_length);
    std::filesystem::__cxx11::path::~path(&local_c0);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    goto LAB_00129ec7;
  }
  std::filesystem::current_path_abi_cxx11_();
  bVar2 = is_subdirectory(this,path,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  if (bVar2) {
    if ((this->repository_)._M_string_length == 0) {
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(&local_c0,path);
      pbVar4 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pbVar4,
                 " is outside the output directory but you have not provided a repository to mdsplit. This will generate a broken link."
                 ,0x75);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar4 + -0x18) + (char)pbVar4);
      std::ostream::put((char)pbVar4);
      std::ostream::flush();
      std::filesystem::__cxx11::path::~path(&local_c0);
      std::filesystem::__cxx11::path::~path(&local_98);
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(__return_storage_ptr__,path);
      goto LAB_00129ebd;
    }
    std::filesystem::__cxx11::path::path(__return_storage_ptr__);
    bVar2 = is_external(&this->repository_);
    if (!bVar2) {
      std::filesystem::__cxx11::path::_M_append(__return_storage_ptr__,0x12,"https://github.com");
    }
    std::filesystem::__cxx11::path::_M_append
              (__return_storage_ptr__,(this->repository_)._M_string_length,
               (this->repository_)._M_dataplus._M_p);
    std::filesystem::__cxx11::path::_M_append(__return_storage_ptr__,0xb,"blob/master");
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::relative(&local_c0,path);
    std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,&local_c0);
    std::filesystem::__cxx11::path::~path(&local_c0);
    this_00 = &local_98;
  }
  else {
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::relative(&local_c0,path);
    pbVar4 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pbVar4,
               " is outside the project directory. There\'s no way to generate a relative link that will work elsewhere. This will generate a broken link in your documentation."
               ,0x9f);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar4 + -0x18) + (char)pbVar4);
    std::ostream::put((char)pbVar4);
    std::ostream::flush();
    std::filesystem::__cxx11::path::~path(&local_c0);
    std::filesystem::__cxx11::path::~path(&local_98);
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::relative(__return_storage_ptr__,path);
LAB_00129ebd:
    this_00 = &local_c0;
  }
  std::filesystem::__cxx11::path::~path(this_00);
LAB_00129ec7:
  std::filesystem::__cxx11::path::~path(&local_50);
  return __return_storage_ptr__;
}

Assistant:

fs::path mdsplitter::relative_path(const fs::path &path,
                                       const fs::path &base) {
        fs::path base_dir = fs::is_directory(base) ? base : base.parent_path();
        bool is_in_docs_dir = is_subdirectory(path, output_dir_);
        bool is_docs_dir = path == this->output_dir_;
        if (is_in_docs_dir && !is_docs_dir) {
            fs::path r = fs::relative(path, base_dir);
            std::string ext = r.extension().string();
            // GitHub does not convert ".md#anchor" links automatically
            /*
            bool is_anchor_inside_docs = ext.rfind(".md#", 0) == 0;
            if (is_anchor_inside_docs) {
                ext.replace(0, 4, ".html#");
                r = r.parent_path() / r.stem();
                r += ext;
            }
             */
            return r;
        } else {
            bool is_in_project_dir = is_subdirectory(path, fs::current_path());
            if (is_in_project_dir) {
                if (!repository_.empty()) {
                    fs::path url;
                    if (!is_external(repository_)) {
                        url /= "https://github.com";
                    }
                    url /= repository_;
                    url /= "blob/master";
                    url /= fs::relative(path, fs::current_path());
                    return url;
                } else {
                    std::cerr << fs::relative(path, fs::current_path())
                              << " is outside the output directory but you "
                                 "have not provided a repository to mdsplit. "
                                 "This will generate a broken link."
                              << std::endl;
                    return fs::relative(path, fs::current_path());
                }
            } else {
                std::cerr
                    << fs::relative(path, fs::current_path())
                    << " is outside the project directory. There's no way to "
                       "generate a relative link that will work elsewhere. "
                       "This will generate a broken link in your documentation."
                    << std::endl;
                return fs::relative(path, fs::current_path());
            }
        }
    }